

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# application.cpp
# Opt level: O1

void __thiscall CS248::Application::load(Application *this,SceneInfo *sceneInfo)

{
  Type TVar1;
  pointer pNVar2;
  LightInfo *light;
  double dVar3;
  double dVar4;
  Application *pAVar5;
  SceneLight *pSVar6;
  Scene *this_00;
  Matrix4x4 *extraout_RDX;
  Matrix4x4 *extraout_RDX_00;
  Matrix4x4 *pMVar7;
  long lVar8;
  uint uVar9;
  ulong uVar10;
  vector<CS248::DynamicScene::SceneLight_*,_std::allocator<CS248::DynamicScene::SceneLight_*>_>
  lights;
  vector<CS248::DynamicScene::SceneObject_*,_std::allocator<CS248::DynamicScene::SceneObject_*>_>
  objects;
  LightInfo default_light;
  PathTracer *local_200;
  undefined1 local_1f8 [8];
  SceneLight **ppSStack_1f0;
  SceneLight **local_1e8;
  undefined1 local_1d8 [8];
  _Base_ptr p_Stack_1d0;
  _Base_ptr local_1c8;
  _Base_ptr local_1c0;
  Vector4D local_1b8;
  undefined1 local_198 [16];
  PathTracer *local_188;
  Scene *pSStack_180;
  PathTracer *local_178;
  Scene *pSStack_170;
  PathTracer *local_168;
  double local_158;
  Application *local_150;
  double local_148;
  double dStack_140;
  vector<CS248::DynamicScene::SceneLight_*,_std::allocator<CS248::DynamicScene::SceneLight_*>_>
  local_130;
  vector<CS248::DynamicScene::SceneObject_*,_std::allocator<CS248::DynamicScene::SceneObject_*>_>
  local_118;
  undefined1 local_100 [84];
  float local_ac;
  undefined1 local_48 [16];
  
  local_1f8 = (undefined1  [8])0x0;
  ppSStack_1f0 = (SceneLight **)0x0;
  local_1e8 = (SceneLight **)0x0;
  local_1c8 = (_Base_ptr)0x0;
  local_1d8 = (undefined1  [8])0x0;
  p_Stack_1d0 = (_Base_ptr)0x0;
  uVar9 = (int)((long)(sceneInfo->nodes).
                      super__Vector_base<CS248::Collada::Node,_std::allocator<CS248::Collada::Node>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)(sceneInfo->nodes).
                      super__Vector_base<CS248::Collada::Node,_std::allocator<CS248::Collada::Node>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x3d70a3d7;
  local_150 = this;
  if ((int)uVar9 < 1) {
    local_198 = ZEXT816(0);
    local_148 = 0.0;
    dStack_140 = 0.0;
  }
  else {
    uVar10 = (ulong)(uVar9 & 0x7fffffff);
    local_198 = ZEXT816(0);
    lVar8 = 0x48;
    local_200 = (PathTracer *)0x0;
    local_148 = 0.0;
    dStack_140 = 0.0;
    local_188 = (PathTracer *)0x0;
    pSStack_180 = (Scene *)0x0;
    do {
      pNVar2 = (sceneInfo->nodes).
               super__Vector_base<CS248::Collada::Node,_std::allocator<CS248::Collada::Node>_>.
               _M_impl.super__Vector_impl_data._M_start;
      light = *(LightInfo **)((long)(pNVar2->transform).entries + lVar8 + 0xffffffffffffffb0U);
      TVar1 = (light->super_Instance).type;
      if (TVar1 < MATERIAL) {
        pMVar7 = (Matrix4x4 *)((long)(pNVar2->transform).entries + lVar8 + -0x48);
        switch(TVar1) {
        case CAMERA:
          local_1b8.x = (double)local_188;
          local_1b8.y = (double)pSStack_180;
          local_1b8.z = (double)local_200;
          local_1b8.w = 1.0;
          Matrix4x4::operator*(pMVar7,&local_1b8);
          Vector4D::to3D((Vector4D *)local_100);
          local_188 = local_178;
          pSStack_180 = pSStack_170;
          local_200 = local_168;
          local_1b8.x._0_4_ = light->light_type;
          local_1b8.x._4_4_ = (light->spectrum).r;
          local_1b8.y._0_4_ = (light->spectrum).g;
          local_1b8.y._4_4_ = (light->spectrum).b;
          local_1b8.z = (light->position).x;
          local_1b8.w = 1.0;
          Matrix4x4::operator*(pMVar7,&local_1b8);
          Vector4D::to3D((Vector4D *)local_100);
          dVar4 = (double)local_168 * (double)local_168 +
                  (double)local_178 * (double)local_178 + (double)pSStack_170 * (double)pSStack_170;
          if (dVar4 < 0.0) {
            dVar4 = sqrt(dVar4);
            pMVar7 = extraout_RDX_00;
          }
          else {
            dVar4 = SQRT(dVar4);
            pMVar7 = extraout_RDX;
          }
          dVar4 = 1.0 / dVar4;
          local_198._8_4_ = SUB84(dVar4 * (double)pSStack_170,0);
          local_198._0_8_ = dVar4 * (double)local_178;
          local_198._12_4_ = (int)((ulong)(dVar4 * (double)pSStack_170) >> 0x20);
          local_148 = dVar4 * (double)local_168;
          dStack_140 = 0.0;
          this = local_150;
          init_camera(local_150,(CameraInfo *)light,pMVar7);
          break;
        case LIGHT:
          local_100._0_8_ = init_light(this,light,pMVar7);
          if (ppSStack_1f0 == local_1e8) {
            this = (Application *)local_1f8;
            std::
            vector<CS248::DynamicScene::SceneLight*,std::allocator<CS248::DynamicScene::SceneLight*>>
            ::_M_realloc_insert<CS248::DynamicScene::SceneLight*>
                      ((vector<CS248::DynamicScene::SceneLight*,std::allocator<CS248::DynamicScene::SceneLight*>>
                        *)this,(iterator)ppSStack_1f0,(SceneLight **)local_100);
          }
          else {
            *ppSStack_1f0 = (SceneLight *)local_100._0_8_;
            ppSStack_1f0 = ppSStack_1f0 + 1;
          }
          break;
        case SPHERE:
          local_100._0_8_ = init_sphere(this,(SphereInfo *)light,pMVar7);
          if (p_Stack_1d0 == local_1c8) {
            this = (Application *)local_1d8;
            std::
            vector<CS248::DynamicScene::SceneObject*,std::allocator<CS248::DynamicScene::SceneObject*>>
            ::_M_realloc_insert<CS248::DynamicScene::SceneObject*>
                      ((vector<CS248::DynamicScene::SceneObject*,std::allocator<CS248::DynamicScene::SceneObject*>>
                        *)this,(iterator)p_Stack_1d0,(SceneObject **)local_100);
          }
          else {
LAB_0018a18d:
            *(undefined8 *)p_Stack_1d0 = local_100._0_8_;
            p_Stack_1d0 = (_Base_ptr)&p_Stack_1d0->_M_parent;
          }
          break;
        case POLYMESH:
          local_100._0_8_ = init_polymesh(this,(PolymeshInfo *)light,pMVar7);
          if (p_Stack_1d0 != local_1c8) goto LAB_0018a18d;
          this = (Application *)local_1d8;
          std::
          vector<CS248::DynamicScene::SceneObject*,std::allocator<CS248::DynamicScene::SceneObject*>>
          ::_M_realloc_insert<CS248::DynamicScene::SceneObject*>
                    ((vector<CS248::DynamicScene::SceneObject*,std::allocator<CS248::DynamicScene::SceneObject*>>
                      *)this,(iterator)p_Stack_1d0,(SceneObject **)local_100);
        }
      }
      lVar8 = lVar8 + 200;
      uVar10 = uVar10 - 1;
    } while (uVar10 != 0);
  }
  pAVar5 = local_150;
  if ((undefined1  [8])ppSStack_1f0 == local_1f8) {
    Collada::LightInfo::LightInfo((LightInfo *)local_100);
    pSVar6 = (SceneLight *)operator_new(0x18);
    pSVar6->_vptr_SceneLight = (_func_int **)&PTR_get_static_light_002672d8;
    pSVar6[1]._vptr_SceneLight = (_func_int **)0x0;
    *(undefined4 *)&pSVar6[2]._vptr_SceneLight = 0;
    pSVar6[1]._vptr_SceneLight = (_func_int **)local_100._76_8_;
    *(float *)&pSVar6[2]._vptr_SceneLight = local_ac;
    local_1b8.x = (double)pSVar6;
    if (ppSStack_1f0 == local_1e8) {
      std::vector<CS248::DynamicScene::SceneLight*,std::allocator<CS248::DynamicScene::SceneLight*>>
      ::_M_realloc_insert<CS248::DynamicScene::SceneLight*>
                ((vector<CS248::DynamicScene::SceneLight*,std::allocator<CS248::DynamicScene::SceneLight*>>
                  *)local_1f8,(iterator)ppSStack_1f0,(SceneLight **)&local_1b8);
    }
    else {
      *ppSStack_1f0 = pSVar6;
      ppSStack_1f0 = ppSStack_1f0 + 1;
    }
    if ((undefined1 *)local_100._40_8_ != local_100 + 0x38) {
      operator_delete((void *)local_100._40_8_);
    }
    if ((undefined1 *)local_100._8_8_ != local_100 + 0x18) {
      operator_delete((void *)local_100._8_8_);
    }
  }
  this_00 = (Scene *)operator_new(0x128);
  std::
  vector<CS248::DynamicScene::SceneObject_*,_std::allocator<CS248::DynamicScene::SceneObject_*>_>::
  vector(&local_118,
         (vector<CS248::DynamicScene::SceneObject_*,_std::allocator<CS248::DynamicScene::SceneObject_*>_>
          *)local_1d8);
  std::vector<CS248::DynamicScene::SceneLight_*,_std::allocator<CS248::DynamicScene::SceneLight_*>_>
  ::vector(&local_130,
           (vector<CS248::DynamicScene::SceneLight_*,_std::allocator<CS248::DynamicScene::SceneLight_*>_>
            *)local_1f8);
  DynamicScene::Scene::Scene(this_00,&local_118,&local_130);
  pAVar5->scene = this_00;
  if (local_130.
      super__Vector_base<CS248::DynamicScene::SceneLight_*,_std::allocator<CS248::DynamicScene::SceneLight_*>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_130.
                    super__Vector_base<CS248::DynamicScene::SceneLight_*,_std::allocator<CS248::DynamicScene::SceneLight_*>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_118.
      super__Vector_base<CS248::DynamicScene::SceneObject_*,_std::allocator<CS248::DynamicScene::SceneObject_*>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_118.
                    super__Vector_base<CS248::DynamicScene::SceneObject_*,_std::allocator<CS248::DynamicScene::SceneObject_*>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  DynamicScene::Scene::get_bbox((BBox *)local_100,pAVar5->scene);
  if ((((double)local_100._24_8_ <= (double)local_100._0_8_) &&
      ((double)local_100._32_8_ <= (double)local_100._8_8_)) &&
     ((double)local_100._40_8_ <= (double)local_100._16_8_)) {
    local_1b8.z = ((double)local_100._40_8_ + (double)local_100._16_8_) * 0.5;
    dVar4 = ((double)local_100._8_8_ + (double)local_100._32_8_) * 0.5;
    local_1b8.y._0_4_ = SUB84(dVar4,0);
    local_1b8.x = ((double)local_100._0_8_ + (double)local_100._24_8_) * 0.5;
    local_1b8.y._4_4_ = (int)((ulong)dVar4 >> 0x20);
    dVar4 = (double)local_100._64_8_ * (double)local_100._64_8_ +
            (double)local_100._48_8_ * (double)local_100._48_8_ +
            (double)local_100._56_8_ * (double)local_100._56_8_;
    if (dVar4 < 0.0) {
      dVar4 = sqrt(dVar4);
    }
    else {
      dVar4 = SQRT(dVar4);
    }
    dVar4 = dVar4 * 0.5 * 1.5;
    pAVar5->canonical_view_distance = dVar4;
    local_158 = dVar4 / 10.0;
    local_188 = (PathTracer *)(dVar4 + dVar4);
    local_48._8_4_ = local_198._8_4_;
    local_48._0_8_ = local_198._8_8_;
    local_48._12_4_ = local_198._12_4_;
    local_1c0 = (_Base_ptr)acos(local_198._8_8_);
    dVar3 = atan2((double)local_198._0_8_,local_148);
    Camera::place(&pAVar5->canonicalCamera,(Vector3D *)&local_1b8,(double)local_1c0,dVar3,
                  (double)local_188,local_158,dVar4 * 20.0);
    local_1c0 = (_Base_ptr)acos((double)local_48._0_8_);
    dVar3 = atan2((double)local_198._0_8_,local_148);
    Camera::place(&pAVar5->camera,(Vector3D *)&local_1b8,(double)local_1c0,dVar3,(double)local_188,
                  local_158,dVar4 * 20.0);
    pAVar5->scroll_rate = pAVar5->canonical_view_distance / 10.0;
  }
  DynamicScene::Scene::set_draw_styles
            (pAVar5->scene,&pAVar5->defaultStyle,&pAVar5->hoverStyle,&pAVar5->selectStyle);
  if (local_1d8 != (undefined1  [8])0x0) {
    operator_delete((void *)local_1d8);
  }
  if (local_1f8 != (undefined1  [8])0x0) {
    operator_delete((void *)local_1f8);
  }
  return;
}

Assistant:

void Application::load(SceneInfo *sceneInfo) {
  vector<Collada::Node> &nodes = sceneInfo->nodes;
  vector<DynamicScene::SceneLight *> lights;
  vector<DynamicScene::SceneObject *> objects;

  // save camera position to update camera control later
  CameraInfo *c;
  Vector3D c_pos = Vector3D();
  Vector3D c_dir = Vector3D();

  int len = nodes.size();
  for (int i = 0; i < len; i++) {
    Collada::Node &node = nodes[i];
    Collada::Instance *instance = node.instance;
    const Matrix4x4 &transform = node.transform;

    switch (instance->type) {
      case Collada::Instance::CAMERA:
        c = static_cast<CameraInfo *>(instance);
        c_pos = (transform * Vector4D(c_pos, 1)).to3D();
        c_dir = (transform * Vector4D(c->view_dir, 1)).to3D().unit();
        init_camera(*c, transform);
        break;
      case Collada::Instance::LIGHT: {
        lights.push_back(
            init_light(static_cast<LightInfo &>(*instance), transform));
        break;
      }
      case Collada::Instance::SPHERE:
        objects.push_back(
            init_sphere(static_cast<SphereInfo &>(*instance), transform));
        break;
      case Collada::Instance::POLYMESH:
        objects.push_back(
            init_polymesh(static_cast<PolymeshInfo &>(*instance), transform));
        break;
      case Collada::Instance::MATERIAL:
        init_material(static_cast<MaterialInfo &>(*instance));
        break;
    }
  }

  if (lights.size() == 0) {  // no lights, default use ambient_light
    LightInfo default_light = LightInfo();
    lights.push_back(new DynamicScene::AmbientLight(default_light));
  }
  scene = new DynamicScene::Scene(objects, lights);

  const BBox &bbox = scene->get_bbox();
  if (!bbox.empty()) {
    Vector3D target = bbox.centroid();
    canonical_view_distance = bbox.extent.norm() / 2 * 1.5;

    double view_distance = canonical_view_distance * 2;
    double min_view_distance = canonical_view_distance / 10.0;
    double max_view_distance = canonical_view_distance * 20.0;

    canonicalCamera.place(target, acos(c_dir.y), atan2(c_dir.x, c_dir.z),
                          view_distance, min_view_distance, max_view_distance);

    camera.place(target, acos(c_dir.y), atan2(c_dir.x, c_dir.z), view_distance,
                 min_view_distance, max_view_distance);

    set_scroll_rate();
  }

  // set default draw styles for meshEdit -
  scene->set_draw_styles(&defaultStyle, &hoverStyle, &selectStyle);

  // cerr << "==================================" << endl;
  // cerr << "CAMERA" << endl;
  // cerr << "      hFov: " << camera.hFov << endl;
  // cerr << "      vFov: " << camera.vFov << endl;
  // cerr << "        ar: " << camera.ar << endl;
  // cerr << "     nClip: " << camera.nClip << endl;
  // cerr << "     fClip: " << camera.fClip << endl;
  // cerr << "       pos: " << camera.pos << endl;
  // cerr << " targetPos: " << camera.targetPos << endl;
  // cerr << "       phi: " << camera.phi << endl;
  // cerr << "     theta: " << camera.theta << endl;
  // cerr << "         r: " << camera.r << endl;
  // cerr << "      minR: " << camera.minR << endl;
  // cerr << "      maxR: " << camera.maxR << endl;
  // cerr << "       c2w: " << camera.c2w << endl;
  // cerr << "   screenW: " << camera.screenW << endl;
  // cerr << "   screenH: " << camera.screenH << endl;
  // cerr << "screenDist: " << camera.screenDist<< endl;
  // cerr << "==================================" << endl;
}